

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

void Abc_TtSwapVars(word *pTruth,int nVars,int iVar,int jVar)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  word *pwVar15;
  ulong uVar16;
  word *pwVar17;
  word *pwVar18;
  word *pwVar19;
  word *pLimit;
  
  if (iVar != jVar) {
    iVar4 = iVar;
    if (iVar < jVar) {
      iVar4 = jVar;
    }
    if (jVar < iVar) {
      iVar = jVar;
    }
    if ((iVar4 <= iVar) || (nVars <= iVar4)) {
      __assert_fail("iVar < jVar && jVar < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x59b,"void Abc_TtSwapVars(word *, int, int, int)");
    }
    bVar6 = (byte)iVar;
    if (nVars < 7) {
      uVar13 = *pTruth;
      bVar6 = (char)(-1 << (bVar6 & 0x1f)) + (char)(1 << ((byte)iVar4 & 0x1f));
      lVar5 = (long)iVar4;
      lVar8 = (long)iVar * 0x90;
      *pTruth = (uVar13 & *(ulong *)(lVar8 + 0xa04e40 + lVar5 * 0x18)) >> (bVar6 & 0x3f) |
                (*(ulong *)(lVar8 + 0xa04e38 + lVar5 * 0x18) & uVar13) << (bVar6 & 0x3f) |
                s_PPMasks[iVar][lVar5][0] & uVar13;
    }
    else {
      iVar10 = nVars + -6;
      if (iVar4 < 6) {
        if (iVar10 != 0x1f) {
          uVar11 = 1 << ((byte)iVar10 & 0x1f);
          bVar6 = (char)(1 << ((byte)iVar4 & 0x1f)) + (char)(-1 << (bVar6 & 0x1f));
          lVar5 = (long)iVar4;
          lVar8 = (long)iVar * 0x90;
          uVar13 = s_PPMasks[iVar][lVar5][0];
          uVar12 = *(ulong *)(lVar8 + 0xa04e38 + lVar5 * 0x18);
          uVar16 = *(ulong *)(lVar8 + 0xa04e40 + lVar5 * 0x18);
          if ((int)uVar11 < 2) {
            uVar11 = 1;
          }
          uVar14 = 0;
          do {
            uVar2 = pTruth[uVar14];
            pTruth[uVar14] =
                 (uVar2 & uVar16) >> (bVar6 & 0x3f) |
                 (uVar12 & uVar2) << (bVar6 & 0x3f) | uVar13 & uVar2;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
      }
      else {
        pwVar1 = pTruth + (1 << ((byte)iVar10 & 0x1f));
        if (iVar < 6) {
          if (iVar10 != 0x1f) {
            bVar7 = (byte)(iVar4 + -6);
            uVar11 = 1 << (bVar7 & 0x1f);
            iVar10 = 2 << (bVar7 & 0x1f);
            uVar13 = 1;
            if (1 < (int)uVar11) {
              uVar13 = (ulong)uVar11;
            }
            pwVar15 = pTruth + (int)uVar11;
            do {
              if (iVar4 + -6 != 0x1f) {
                uVar12 = s_Truths6[iVar];
                uVar16 = 0;
                do {
                  uVar14 = pTruth[uVar16];
                  bVar7 = (byte)(1 << (bVar6 & 0x1f));
                  uVar2 = pwVar15[uVar16];
                  pTruth[uVar16] = uVar14 & ~uVar12 | uVar2 << (bVar7 & 0x3f) & uVar12;
                  pwVar15[uVar16] = uVar2 & uVar12 | (uVar12 & uVar14) >> (bVar7 & 0x3f);
                  uVar16 = uVar16 + 1;
                } while (uVar13 != uVar16);
              }
              pTruth = pTruth + iVar10;
              pwVar15 = pwVar15 + iVar10;
            } while (pTruth < pwVar1);
          }
        }
        else if (iVar10 != 0x1f) {
          bVar6 = (byte)(iVar4 + -6);
          bVar7 = (byte)(iVar + -6);
          uVar11 = 1 << (bVar7 & 0x1f);
          iVar10 = 2 << (bVar6 & 0x1f);
          uVar13 = 1;
          if (1 < (int)uVar11) {
            uVar13 = (ulong)uVar11;
          }
          lVar5 = (long)(2 << (bVar7 & 0x1f));
          lVar8 = (long)(1 << (bVar6 & 0x1f));
          pwVar15 = pTruth + lVar8;
          pwVar19 = pTruth + (int)uVar11;
          do {
            if (iVar4 + -6 != 0x1f) {
              lVar9 = 0;
              pwVar17 = pwVar19;
              pwVar18 = pwVar15;
              do {
                if (iVar + -6 != 0x1f) {
                  uVar12 = 0;
                  do {
                    wVar3 = pwVar17[uVar12];
                    pwVar17[uVar12] = pwVar18[uVar12];
                    pwVar18[uVar12] = wVar3;
                    uVar12 = uVar12 + 1;
                  } while (uVar13 != uVar12);
                }
                lVar9 = lVar9 + lVar5;
                pwVar18 = pwVar18 + lVar5;
                pwVar17 = pwVar17 + lVar5;
              } while (lVar9 < lVar8);
            }
            pTruth = pTruth + iVar10;
            pwVar15 = pwVar15 + iVar10;
            pwVar19 = pwVar19 + iVar10;
          } while (pTruth < pwVar1);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtSwapVars( word * pTruth, int nVars, int iVar, int jVar )
{
    if ( iVar == jVar )
        return;
    if ( jVar < iVar )
        ABC_SWAP( int, iVar, jVar );
    assert( iVar < jVar && jVar < nVars );
    if ( nVars <= 6 )
    {
        pTruth[0] = Abc_Tt6SwapVars( pTruth[0], iVar, jVar );
        return;
    }
    if ( jVar <= 5 )
    {
        word * s_PMasks = s_PPMasks[iVar][jVar];
        int nWords = Abc_TtWordNum(nVars);
        int w, shift = (1 << jVar) - (1 << iVar);
        for ( w = 0; w < nWords; w++ )
            pTruth[w] = (pTruth[w] & s_PMasks[0]) | ((pTruth[w] & s_PMasks[1]) << shift) | ((pTruth[w] & s_PMasks[2]) >> shift);
        return;
    }
    if ( iVar <= 5 && jVar > 5 )
    {
        word low2High, high2Low;
        word * pLimit = pTruth + Abc_TtWordNum(nVars);
        int j, jStep = Abc_TtWordNum(jVar);
        int shift = 1 << iVar;
        for ( ; pTruth < pLimit; pTruth += 2*jStep )
            for ( j = 0; j < jStep; j++ )
            {
                low2High = (pTruth[j] & s_Truths6[iVar]) >> shift;
                high2Low = (pTruth[j+jStep] << shift) & s_Truths6[iVar];
                pTruth[j] = (pTruth[j] & ~s_Truths6[iVar]) | high2Low;
                pTruth[j+jStep] = (pTruth[j+jStep] & s_Truths6[iVar]) | low2High;
            }
        return;
    }
    {
        word * pLimit = pTruth + Abc_TtWordNum(nVars);
        int i, iStep = Abc_TtWordNum(iVar);
        int j, jStep = Abc_TtWordNum(jVar);
        for ( ; pTruth < pLimit; pTruth += 2*jStep )
            for ( i = 0; i < jStep; i += 2*iStep )
                for ( j = 0; j < iStep; j++ )
                    ABC_SWAP( word, pTruth[iStep + i + j], pTruth[jStep + i + j] );
        return;
    }    
}